

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O1

int analyze_miniscript(char *miniscript,char **key_name_array,char **key_value_array,
                      size_t array_len,uint32_t target,uint32_t *network,uint32_t flags,
                      miniscript_node_t *prev_node,miniscript_node_t *parent_node,
                      miniscript_node_t **generate_node,char **script_ignore_checksum)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  size_t sVar5;
  miniscript_node_t *parent_node_00;
  char *pcVar6;
  char *pcVar7;
  long lVar8;
  uchar *bytes_out;
  longlong lVar9;
  uint32_t *puVar10;
  miniscript_item_t *pmVar11;
  size_t __n;
  uint32_t *astarisk_index;
  bool bVar12;
  bool bVar13;
  size_t sVar14;
  address_script_t *target_addr_item;
  uint32_t result;
  uint uVar15;
  size_t __n_00;
  int iVar16;
  uint32_t uVar17;
  size_t buf_len_1;
  char *sub_str;
  size_t local_270;
  miniscript_node_t *child;
  size_t sub_str_len;
  size_t local_258;
  char **local_250;
  char **local_248;
  miniscript_node_t *local_240;
  char *local_238;
  uint32_t *local_230;
  char *local_228;
  char work_checksum [12];
  char checksum [12];
  uchar privkey_bytes [38];
  uchar pubkey [65];
  char buffer [64];
  size_t buf_len;
  uchar local_109;
  uint32_t local_d0;
  uchar local_88 [88];
  
  sub_str = (char *)0x0;
  sub_str_len = 0;
  child = (miniscript_node_t *)0x0;
  astarisk_index = network;
  local_270 = array_len;
  local_250 = key_value_array;
  local_248 = key_name_array;
  sVar5 = strlen(miniscript);
  parent_node_00 = (miniscript_node_t *)wally_malloc(0x80);
  if (parent_node_00 == (miniscript_node_t *)0x0) {
    return -3;
  }
  wally_bzero(parent_node_00,0x80);
  wally_bzero(buffer,0x40);
  wally_bzero(checksum,0xc);
  wally_bzero(work_checksum,0xc);
  if (parent_node != (miniscript_node_t *)0x0) {
    parent_node_00->parent = parent_node;
  }
  if (sVar5 == 0) {
    bVar3 = false;
    __n = 0;
    iVar4 = 0;
  }
  else {
    local_238 = parent_node_00->wrapper_str;
    local_240 = (miniscript_node_t *)0x0;
    __n = 0;
    bVar12 = false;
    bVar3 = false;
    bVar2 = false;
    iVar16 = 0;
    puVar10 = (uint32_t *)0x0;
    astarisk_index = (uint32_t *)0x0;
    local_258 = sVar5;
    do {
      pmVar11 = parent_node_00->info;
      if ((pmVar11 == (miniscript_item_t *)0x0) && (miniscript[__n] == ':')) {
        if (0xc < __n - (long)astarisk_index) {
LAB_00108363:
          iVar4 = -2;
          goto LAB_0010836e;
        }
        memcpy(local_238,(char *)((long)astarisk_index + (long)miniscript),
               __n - (long)astarisk_index);
        astarisk_index = (uint32_t *)(__n + 1);
      }
      else {
        cVar1 = miniscript[__n];
        bVar13 = bVar12;
        if (cVar1 == ',') {
          if (iVar16 == 1) {
            bVar13 = true;
          }
          if (!bVar2) {
            bVar13 = bVar12;
          }
LAB_00108222:
          bVar12 = bVar13;
          bVar3 = true;
        }
        else if (cVar1 == ')') {
          bVar3 = true;
          if (iVar16 == 0) {
            iVar16 = 0;
          }
          else {
            iVar16 = iVar16 + -1;
            bVar3 = true;
            if ((bool)(iVar16 == 0 & bVar2)) {
              astarisk_index = (uint32_t *)(__n + 1);
              bVar3 = true;
              iVar16 = 0;
              bVar2 = false;
              bVar12 = true;
            }
          }
        }
        else {
          if (cVar1 == '(') {
            if (iVar16 == 0 && pmVar11 == (miniscript_item_t *)0x0) {
              memcpy(buffer,miniscript + (long)astarisk_index,__n - (long)astarisk_index);
              sVar5 = strlen(buffer);
              lVar8 = 0;
              do {
                if (((*(uint *)((long)&miniscript_info_table[0].kind + lVar8) & target) != 0) &&
                   (iVar4 = bcmp(buffer,*(void **)((long)&miniscript_info_table[0].name + lVar8),
                                 sVar5 + 1), iVar4 == 0)) {
                  pmVar11 = (miniscript_item_t *)((long)&miniscript_info_table[0].name + lVar8);
                  goto LAB_001081d7;
                }
                lVar8 = lVar8 + 0x28;
              } while (lVar8 != 0x438);
              pmVar11 = (miniscript_item_t *)0x0;
LAB_001081d7:
              parent_node_00->info = pmVar11;
              if ((pmVar11 == (miniscript_item_t *)0x0) ||
                 ((parent_node_00->wrapper_str[0] != '\0' && ((pmVar11->kind & 1) == 0))))
              goto LAB_00108363;
              puVar10 = (uint32_t *)(__n + 1);
              bVar2 = true;
              astarisk_index = puVar10;
              sVar5 = local_258;
            }
            iVar16 = iVar16 + 1;
            goto LAB_00108222;
          }
          if ((cVar1 == '#' && parent_node == (miniscript_node_t *)0x0) &&
             ((iVar16 == 0 && !bVar2) && pmVar11 != (miniscript_item_t *)0x0)) {
            sVar5 = strlen(miniscript + __n + 1);
            iVar4 = -2;
            if (sVar5 < 0xc) {
              memcpy(checksum,miniscript + __n + 1,sVar5);
              iVar4 = 0;
            }
            goto LAB_00108378;
          }
        }
      }
      if (bVar12) {
        sVar14 = __n - (long)puVar10;
        local_230 = astarisk_index;
        iVar4 = realloc_substr_buffer(sVar14,&sub_str,&sub_str_len);
        pcVar7 = sub_str;
        if (iVar4 != 0) goto LAB_0010836e;
        memcpy(sub_str,miniscript + (long)puVar10,sVar14);
        pcVar7[sVar14] = '\0';
        astarisk_index = network;
        iVar4 = analyze_miniscript(pcVar7,local_248,local_250,local_270,target,network,flags,
                                   local_240,parent_node_00,&child,(char **)0x0);
        if (iVar4 != 0) {
          __n = 0;
          goto LAB_00108378;
        }
        local_240 = child;
        child = (miniscript_node_t *)0x0;
        astarisk_index = local_230;
        if (miniscript[__n] == ',') {
          puVar10 = (uint32_t *)(__n + 1);
          astarisk_index = (uint32_t *)(__n + 1);
        }
        bVar12 = false;
        sVar5 = local_258;
      }
      __n = __n + 1;
    } while (__n != sVar5);
    iVar4 = 0;
LAB_0010836e:
    __n = 0;
  }
LAB_00108378:
  if ((iVar4 != 0) || (iVar4 = 0, bVar3)) goto LAB_00108386;
  local_228 = (char *)0x0;
  if (parent_node == (miniscript_node_t *)0x0) {
    if (miniscript == (char *)0x0) {
      iVar4 = -2;
      goto LAB_00108386;
    }
  }
  else {
    iVar4 = -2;
    if ((miniscript == (char *)0x0) || (parent_node->info == (miniscript_item_t *)0x0))
    goto LAB_00108386;
  }
  iVar4 = -2;
  if (*miniscript == '\0') goto LAB_00108386;
  if (network == (uint32_t *)0x0) {
    target_addr_item = (address_script_t *)0x0;
  }
  else {
    target_addr_item = (address_script_t *)0x0;
    lVar8 = 0;
    do {
      if (*network == (uint)(&g_network_address_table[0].network)[lVar8]) {
        target_addr_item = (address_script_t *)(&g_network_address_table[0].network + lVar8);
        break;
      }
      lVar8 = lVar8 + 0x10;
    } while (lVar8 != 0x50);
    if (target_addr_item == (address_script_t *)0x0) goto LAB_00108386;
  }
  sVar5 = strlen(miniscript);
  if ((parent_node != (miniscript_node_t *)0x0) && (parent_node->info->kind == 0x40002)) {
    iVar4 = analyze_miniscript_addr
                      (miniscript,parent_node_00,parent_node,target_addr_item,(uchar *)0x0,0,
                       (size_t *)0x0);
    goto LAB_00108386;
  }
  if (local_270 != 0) {
    sVar14 = 0;
    do {
      iVar4 = strncmp(miniscript,local_248[sVar14],sVar5 + 1);
      if (iVar4 == 0) {
        pcVar7 = wally_strdup(local_250[sVar14]);
        parent_node_00->data = pcVar7;
        if (pcVar7 == (char *)0x0) goto LAB_00108a0b;
        sVar5 = strlen(pcVar7);
        parent_node_00->data_size = (uint32_t)sVar5;
        break;
      }
      sVar14 = sVar14 + 1;
    } while (local_270 != sVar14);
  }
  if (parent_node_00->data == (char *)0x0) {
    pcVar7 = wally_strdup(miniscript);
    parent_node_00->data = pcVar7;
    parent_node_00->data_size = (uint32_t)sVar5;
  }
  if (parent_node != (miniscript_node_t *)0x0) {
    iVar4 = parent_node->info->kind;
    if (iVar4 < 0x50001) {
      if ((iVar4 != 0x30001) && (iVar4 != 0x40001)) goto LAB_001088ab;
    }
    else if ((1 < iVar4 - 0x50001U) && (iVar4 != 0x60001)) goto LAB_001088ab;
    bytes_out = (uchar *)wally_strdup(parent_node_00->data);
    if (bytes_out == (uchar *)0x0) {
LAB_00108a0b:
      iVar4 = -3;
    }
    else {
      iVar4 = wally_hex_to_bytes(parent_node_00->data,bytes_out,sVar5,&buf_len);
      if (iVar4 == 0) {
        parent_node_00->kind = 4;
      }
      wally_free_string((char *)bytes_out);
    }
    goto LAB_00108386;
  }
LAB_001088ab:
  lVar9 = strtoll(parent_node_00->data,&local_228,10);
  parent_node_00->number = lVar9;
  if ((local_228 == (char *)0x0) || (*local_228 == '\0')) {
    parent_node_00->kind = 8;
    uVar17 = 0x35101;
    if (lVar9 == 0) {
      uVar17 = 0x3b901;
    }
    parent_node_00->type_properties = uVar17;
    iVar4 = 0;
    goto LAB_00108386;
  }
  sVar5 = strlen(parent_node_00->data);
  if ((parent_node == (miniscript_node_t *)0x0) || (parent_node->info != (miniscript_item_t *)0x0))
  {
    wally_bzero(&buf_len,0xc0);
    pcVar7 = parent_node_00->data;
    if (*pcVar7 != '[') {
LAB_0010899a:
      if (((flags & 1) == 0) && ((sVar5 == 0x82 || (sVar5 == 0x42)))) {
        iVar4 = wally_hex_to_bytes(parent_node_00->data,pubkey,0x41,&buf_len_1);
        if (iVar4 == 0) {
          parent_node_00->kind = 0x1020;
          if (sVar5 == 0x82) {
            parent_node_00->is_uncompress_key = true;
          }
LAB_00108cb8:
          iVar4 = wally_ec_public_key_verify(pubkey,buf_len_1);
          goto LAB_00108386;
        }
      }
      else if (((flags & 1) != 0) &&
              ((sVar5 == 0x40 &&
               (iVar4 = wally_hex_to_bytes(parent_node_00->data,pubkey,0x41,&buf_len_1), iVar4 == 0)
               ))) {
        parent_node_00->kind = 0x1020;
        parent_node_00->is_xonly_key = true;
        memmove(pubkey + 1,pubkey,buf_len_1);
        pubkey[0] = '\x02';
        buf_len_1 = buf_len_1 + 1;
        goto LAB_00108cb8;
      }
      iVar4 = wally_base58_to_bytes(parent_node_00->data,1,privkey_bytes,0x26,&buf_len_1);
      if (buf_len_1 < 0x23 && iVar4 == 0) {
        if ((target_addr_item == (address_script_t *)0x0) ||
           (iVar4 = -2, target_addr_item->version_wif == privkey_bytes[0])) {
          if (buf_len_1 == 0x21) {
            parent_node_00->kind = 0x2020;
            parent_node_00->is_uncompress_key = true;
            iVar4 = -2;
            if ((flags & 1) != 0) goto LAB_00108386;
          }
          else {
            iVar4 = -2;
            if ((buf_len_1 != 0x22) || (privkey_bytes[0x21] != '\x01')) goto LAB_00108386;
            parent_node_00->kind = 0x2020;
            if ((flags & 1) != 0) {
              parent_node_00->is_xonly_key = true;
            }
          }
          iVar4 = wally_ec_private_key_verify(privkey_bytes + 1,0x20);
        }
        goto LAB_00108386;
      }
      pcVar7 = strchr(parent_node_00->data,0x2f);
      if (pcVar7 != (char *)0x0) {
        iVar4 = -2;
        if (pcVar7[1] == '/') goto LAB_00108386;
        pcVar6 = wally_strdup(pcVar7);
        parent_node_00->derive_path = pcVar6;
        if (pcVar6 == (char *)0x0) goto LAB_00108c22;
        sVar5 = strlen(pcVar6);
        parent_node_00->derive_path_len = (uint32_t)sVar5;
        *pcVar7 = '\0';
        pcVar7 = strchr(parent_node_00->derive_path,0x2a);
        if (pcVar7 != (char *)0x0) {
          parent_node_00->is_derive = true;
        }
      }
      iVar4 = wally_base58_to_bytes(parent_node_00->data,1,local_88,0x52,&buf_len_1);
      if (((iVar4 != 0) || (iVar16 = -2, iVar4 = iVar16, 0x52 < buf_len_1)) ||
         (iVar4 = bip32_key_unserialize(local_88,buf_len_1,(ext_key *)&buf_len), iVar4 != 0))
      goto LAB_00108386;
      if (local_109 == '\0') {
        parent_node_00->kind = 0x14020;
        if (local_d0 != 0x488ade4) goto LAB_00108ced;
LAB_00108bfe:
        if ((target_addr_item != (address_script_t *)0x0) &&
           (iVar4 = iVar16, (target_addr_item->network | 2) != 3)) goto LAB_00108386;
      }
      else {
        parent_node_00->kind = 0x24020;
        if (local_d0 == 0x488b21e) goto LAB_00108bfe;
LAB_00108ced:
        if ((target_addr_item != (address_script_t *)0x0) &&
           (iVar4 = iVar16, (target_addr_item->network | 2) == 3)) goto LAB_00108386;
      }
      if ((flags & 1) != 0) {
        parent_node_00->is_xonly_key = true;
      }
      pcVar7 = parent_node_00->derive_path;
      iVar4 = 0;
      if ((pcVar7 != (char *)0x0) && (*pcVar7 != '\0')) {
        iVar4 = convert_bip32_path_to_array
                          (pcVar7,(uint32_t *)0x0,(uint)(local_109 == '\0'),false,(uint32_t *)0x0,
                           (int8_t *)astarisk_index);
      }
      goto LAB_00108386;
    }
    pcVar6 = strchr(pcVar7,0x5d);
    if (pcVar6 != (char *)0x0) {
      iVar4 = (int)pcVar6 - (int)pcVar7;
      pcVar7 = (char *)wally_malloc((long)(iVar4 + 2));
      parent_node_00->key_origin_info = pcVar7;
      if (pcVar7 != (char *)0x0) {
        uVar17 = iVar4 + 1;
        __n_00 = (size_t)(int)uVar17;
        memcpy(pcVar7,parent_node_00->data,__n_00);
        parent_node_00->key_origin_info[__n_00] = '\0';
        parent_node_00->key_origin_info_len = uVar17;
        sVar5 = sVar5 - __n_00;
        memmove(parent_node_00->data,pcVar6 + 1,sVar5);
        parent_node_00->data[sVar5] = '\0';
        goto LAB_0010899a;
      }
LAB_00108c22:
      iVar4 = -3;
      goto LAB_00108386;
    }
  }
  iVar4 = -2;
LAB_00108386:
  if (iVar4 == 0) {
    pmVar11 = parent_node_00->info;
    iVar4 = 0;
    if (pmVar11 != (miniscript_item_t *)0x0) {
      if (((pmVar11->kind & 1) != 0) && (parent_node_00->wrapper_str[0] != '\0')) {
        uVar15 = 0;
        lVar8 = 8;
        do {
          pcVar7 = strchr(parent_node_00->wrapper_str,
                          (int)**(char **)((long)&g_network_address_table[4].segwit_prefix + lVar8))
          ;
          if (pcVar7 != (char *)0x0) {
            uVar15 = uVar15 | *(uint *)((long)&miniscript_wrapper_table[0].name + lVar8);
          }
          lVar8 = lVar8 + 0x28;
        } while (lVar8 != 0x198);
        parent_node_00->wrapper = uVar15;
      }
      if ((pmVar11 != (miniscript_item_t *)0x0) &&
         (iVar4 = 0, pmVar11->verify_function != (wally_verify_descriptor_t)0x0)) {
        iVar4 = (*pmVar11->verify_function)(parent_node_00,parent_node);
      }
    }
  }
  if ((((__n != 0) && (parent_node == (miniscript_node_t *)0x0)) && (iVar4 == 0)) &&
     (iVar4 = realloc_substr_buffer(__n + 1,&sub_str,&sub_str_len), pcVar7 = sub_str, iVar4 == 0)) {
    memcpy(sub_str,miniscript,__n);
    pcVar7[__n] = '\0';
    if (script_ignore_checksum != (char **)0x0) {
      pcVar6 = wally_strdup(pcVar7);
      *script_ignore_checksum = pcVar6;
    }
    iVar4 = generate_descriptor_checksum(pcVar7,work_checksum);
    if (iVar4 == 0) {
      iVar4 = (uint)(checksum._0_8_ == work_checksum._0_8_) * 2 + -2;
    }
  }
  if (((parent_node == (miniscript_node_t *)0x0) && (script_ignore_checksum != (char **)0x0)) &&
     (iVar4 == 0)) {
    if (__n == 0) {
      pcVar7 = wally_strdup(miniscript);
      *script_ignore_checksum = pcVar7;
    }
    if (*script_ignore_checksum == (char *)0x0) {
      iVar4 = -3;
    }
  }
  if (iVar4 == 0) {
    if (parent_node_00->wrapper == 0) {
      iVar4 = 0;
    }
    else {
      for (sVar5 = strlen(parent_node_00->wrapper_str); sVar5 != 0; sVar5 = sVar5 - 1) {
        lVar8 = 0;
        do {
          if (**(char **)((long)&miniscript_wrapper_table[0].name + lVar8) ==
              parent_node_00->wrapper_str[sVar5 - 1]) {
            lVar8 = (long)&miniscript_wrapper_table[0].name + lVar8;
            goto LAB_001085c0;
          }
          lVar8 = lVar8 + 0x28;
        } while (lVar8 != 400);
        lVar8 = 0;
LAB_001085c0:
        if (lVar8 == 0) {
          iVar4 = -2;
          goto LAB_001086c8;
        }
        iVar4 = (**(code **)(lVar8 + 0x18))(parent_node_00,0);
        if (iVar4 != 0) goto LAB_001086c8;
      }
      iVar4 = 0;
LAB_001086c8:
      if (iVar4 == 0) {
        iVar4 = check_type_properties(parent_node_00->type_properties);
      }
    }
  }
  if (iVar4 == 0) {
    *generate_node = parent_node_00;
    if ((parent_node != (miniscript_node_t *)0x0) &&
       (parent_node->child == (miniscript_node_t *)0x0)) {
      parent_node->child = parent_node_00;
    }
    if (prev_node == (miniscript_node_t *)0x0) {
      parent_node_00->chain_count = 1;
    }
    else {
      parent_node_00->chain_count = prev_node->chain_count + 1;
      parent_node_00->back = prev_node;
      prev_node->next = parent_node_00;
    }
  }
  else {
    free_miniscript_node(parent_node_00);
  }
  pcVar7 = sub_str;
  if (sub_str != (char *)0x0) {
    wally_bzero(sub_str,sub_str_len);
  }
  wally_free(pcVar7);
  return iVar4;
}

Assistant:

static int analyze_miniscript(
    const char *miniscript,
    const char **key_name_array,
    const char **key_value_array,
    size_t array_len,
    uint32_t target,
    uint32_t *network,
    uint32_t flags,
    struct miniscript_node_t *prev_node,
    struct miniscript_node_t *parent_node,
    struct miniscript_node_t **generate_node,
    char **script_ignore_checksum)
{
    int ret = WALLY_OK;
    char *sub_str = NULL;
    size_t index;
    size_t str_len;
    size_t sub_str_len = 0;
    size_t offset = 0;
    size_t child_offset = 0;
    uint32_t indent = 0;
    bool collect_child = false;
    bool exist_indent = false;
    bool copy_child = false;
    char buffer[64];
    char checksum[12];
    char work_checksum[12];
    size_t checksum_len = 0;
    size_t checksum_index = 0;
    struct miniscript_node_t *node;
    struct miniscript_node_t *child = NULL;
    struct miniscript_node_t *prev_child = NULL;

    str_len = strlen(miniscript);

    node = (struct miniscript_node_t *) wally_malloc(sizeof(struct miniscript_node_t));
    if (!node)
        return WALLY_ENOMEM;

    wally_bzero(node, sizeof(struct miniscript_node_t));
    wally_bzero(buffer, sizeof(buffer));
    wally_bzero(checksum, sizeof(checksum));
    wally_bzero(work_checksum, sizeof(work_checksum));
    if (parent_node)
        node->parent = parent_node;

    for (index = 0; index < str_len; ++index) {
        if (!node->info && (miniscript[index] == ':')) {
            if (index - offset > sizeof(node->wrapper_str)) {
                ret = WALLY_EINVAL;
                break;
            }
            memcpy(node->wrapper_str, &miniscript[offset], index - offset);
            offset = index + 1;
        } else if (miniscript[index] == '(') {
            if (!node->info && (indent == 0)) {
                collect_child = true;
                memcpy(buffer, &miniscript[offset], index - offset);
                node->info = search_miniscript_info(buffer, target);
                if (!node->info) {
                    ret = WALLY_EINVAL;
                    break;
                } else if ((node->wrapper_str[0] != '\0') &&
                           ((node->info->kind & DESCRIPTOR_KIND_MINISCRIPT) == 0)) {
                    ret = WALLY_EINVAL;
                    break;
                }
                offset = index + 1;
                child_offset = offset;
            }
            ++indent;
            exist_indent = true;
        } else if (miniscript[index] == ')') {
            if (indent) {
                --indent;
                if (collect_child && (indent == 0)) {
                    collect_child = false;
                    offset = index + 1;
                    copy_child = true;
                }
            }
            exist_indent = true;
        } else if (miniscript[index] == ',') {
            if (collect_child && (indent == 1)) {
                copy_child = true;
            }
            exist_indent = true;
        } else if (miniscript[index] == '#') {
            if (!parent_node && node->info && !collect_child && (indent == 0)) {
                checksum_index = index;
                checksum_len = strlen(&miniscript[index + 1]);
                if (sizeof(checksum) > checksum_len) {
                    memcpy(checksum, &miniscript[index + 1], checksum_len);
                } else {
                    ret = WALLY_EINVAL;
                }
                break;  /* end */
            }
        }

        if (copy_child) {
            ret = realloc_substr_buffer(index - child_offset, &sub_str, &sub_str_len);
            if (ret != WALLY_OK)
                break;

            memcpy(sub_str, &miniscript[child_offset], index - child_offset);
            sub_str[index - child_offset] = '\0';
            ret = analyze_miniscript(sub_str,
                                     key_name_array,
                                     key_value_array,
                                     array_len,
                                     target,
                                     network,
                                     flags,
                                     prev_child,
                                     node,
                                     &child,
                                     NULL);
            if (ret != WALLY_OK)
                break;

            prev_child = child;
            child = NULL;
            copy_child = false;
            if (miniscript[index] == ',') {
                offset = index + 1;
                child_offset = offset;
            }
        }
    }

    if ((ret == WALLY_OK) && !exist_indent)
        ret = analyze_miniscript_value(miniscript,
                                       key_name_array,
                                       key_value_array,
                                       array_len,
                                       network,
                                       flags,
                                       node,
                                       parent_node);

    if ((ret == WALLY_OK) && node->info && (node->info->kind & DESCRIPTOR_KIND_MINISCRIPT) &&
        (node->wrapper_str[0] != '\0')) {
        node->wrapper = convert_miniscript_wrapper_flag(node->wrapper_str);
    }

    if ((ret == WALLY_OK) && node->info && node->info->verify_function)
        ret = node->info->verify_function(node, parent_node);

    if ((ret == WALLY_OK) && !parent_node && checksum_index) {
        /* check checksum */
        ret = realloc_substr_buffer(checksum_index + 1, &sub_str, &sub_str_len);
        if (ret == WALLY_OK) {
            memcpy(sub_str, miniscript, checksum_index);
            sub_str[checksum_index] = '\0';
            if (script_ignore_checksum)
                *script_ignore_checksum = wally_strdup(sub_str);

            ret = generate_descriptor_checksum(sub_str, work_checksum);
            if ((ret == WALLY_OK) && (memcmp(checksum, work_checksum, DESCRIPTOR_CHECKSUM_LENGTH) != 0)) {
                ret = WALLY_EINVAL;
            }
        }
    }
    if ((ret == WALLY_OK) && !parent_node && script_ignore_checksum) {
        if (!checksum_index)
            *script_ignore_checksum = wally_strdup(miniscript);

        if (*script_ignore_checksum == NULL)
            ret = WALLY_ENOMEM;
    }

    if ((ret == WALLY_OK) && node->wrapper) {
        const struct miniscript_wrapper_item_t *item = NULL;
        size_t len;
        size_t table_idx;
        size_t max;
        /* back from wrapper string */
        max = sizeof(miniscript_wrapper_table) / sizeof(struct miniscript_item_t);
        len = strlen(node->wrapper_str);
        for (index = len; index > 0; --index) {
            item = NULL;
            for (table_idx = 0; table_idx < max; ++table_idx) {
                if (miniscript_wrapper_table[table_idx].name[0] == node->wrapper_str[index - 1]) {
                    item = &miniscript_wrapper_table[table_idx];
                    break;
                }
            }
            if (!item) {
                ret = WALLY_EINVAL;
                break;
            }

            ret = item->verify_function(node, NULL);
            if (ret != WALLY_OK)
                break;
        }
        if (ret == WALLY_OK)
            ret = check_type_properties(node->type_properties);
    }

    if (ret == WALLY_OK) {
        *generate_node = node;
        if (parent_node && !parent_node->child)
            parent_node->child = node;
        if (prev_node) {
            node->chain_count = prev_node->chain_count + 1;
            node->back = prev_node;
            prev_node->next = node;
        } else {
            node->chain_count = 1;
        }
    } else {
        free_miniscript_node(node);
    }

    if (sub_str)
        wally_bzero(sub_str, sub_str_len);
    wally_free(sub_str);
    return ret;
}